

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character-generator.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  AbilityScores *this;
  CharacterClass *pCVar5;
  Character *pCVar6;
  long **pplVar7;
  Character *character;
  string name;
  char local_aa;
  char local_a9;
  Skills *local_a8;
  Character *local_a0;
  int local_94;
  long *local_90;
  long local_88;
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  local_a0 = (Character *)0x0;
  iVar2 = parse_args(argc,argv,&local_a0);
  if (local_a0 != (Character *)0x0) goto LAB_00102f7a;
  local_94 = iVar2;
  if (RANDOM_FLAG == false) {
    RANDOM_FLAG = (bool)ORPG::Characters::request_is_random();
    if (RANDOM_FLAG != false) goto LAB_00102dd7;
    uVar4 = ORPG::Characters::request_race();
  }
  else {
    RANDOM_FLAG = true;
LAB_00102dd7:
    uVar4 = ORPG::Characters::select_race(-1);
  }
  if (RANDOM_FLAG == true) {
    this = (AbilityScores *)operator_new(0x38);
    ORPG::AbilityScores::AbilityScores(this,'\0');
  }
  else {
    this = (AbilityScores *)ORPG::Characters::request_scores();
  }
  if (RANDOM_FLAG == true) {
    uVar3 = ORPG::Characters::random_bg_id();
  }
  else {
    uVar3 = ORPG::Characters::request_background();
  }
  if (RANDOM_FLAG == true) {
    pCVar5 = (CharacterClass *)ORPG::Characters::select_character_class(-1);
  }
  else {
    pCVar5 = (CharacterClass *)ORPG::Characters::request_class();
  }
  if (RANDOM_FLAG == true) {
    local_a8 = (Skills *)operator_new(0x38);
    ORPG::Skills::Skills(local_a8);
  }
  else {
    local_a8 = (Skills *)ORPG::Characters::request_skills();
  }
  local_aa = '\x01';
  local_a9 = '\x01';
  if (RANDOM_FLAG == false) {
    local_a9 = ORPG::Characters::request_hitpoints(pCVar5);
  }
  if (RANDOM_FLAG == false) {
    local_aa = ORPG::Characters::request_equipment();
  }
  if (RANDOM_FLAG == true) {
    local_90 = local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
  }
  else {
    ORPG::Characters::request_name_abi_cxx11_();
  }
  pCVar6 = (Character *)operator_new(0xc0);
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>((string *)local_70,local_90,local_88 + (long)local_90);
  ORPG::Character::Character(pCVar6,uVar4,this,pCVar5,uVar3,local_a8,(string *)local_70);
  local_a0 = pCVar6;
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  iVar2 = 1;
  if (local_aa != '\0') {
    iVar2 = local_94;
  }
  if (local_a9 != '\0') {
    iVar2 = local_94;
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
LAB_00102f7a:
  bVar1 = SHEET_FLAG;
  if (iVar2 == 0) {
    if (SHEET_FLAG == true) {
      pplVar7 = &local_90;
      ORPG::Character::to_ascii_sheet_abi_cxx11_();
    }
    else {
      pplVar7 = local_50;
      ORPG::Character::to_string_abi_cxx11_();
    }
    printf("%s",*pplVar7);
    if (bVar1 == false) {
      if (local_50[0] == local_40) {
        return 0;
      }
    }
    else {
      local_40[0] = local_80[0];
      local_50[0] = local_90;
      if (local_90 == local_80) {
        return 0;
      }
    }
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return iVar2;
}

Assistant:

int main(int argc, char* argv[]) {
    Character* character = nullptr;
    
    int status = parse_args(argc, argv, character); // may exit

    if(character == nullptr) {
        /* begin creating the character here */
        RANDOM_FLAG = RANDOM_FLAG ? RANDOM_FLAG : request_is_random();

        auto race       = RANDOM_FLAG ? new_random_race() : request_race();
        //TODO(incomingstick): randomly generate ability scores, not an empty set
        auto scores     = RANDOM_FLAG ? new AbilityScores : request_scores();
        auto bg         = RANDOM_FLAG ? random_bg_id() : request_background();
        auto charClass  = RANDOM_FLAG ? new_random_character_class() : request_class();
        auto skills     = RANDOM_FLAG ? new Skills : request_skills();
        auto hp         = RANDOM_FLAG ? true : request_hitpoints(charClass);
        auto equipment  = RANDOM_FLAG ? true : request_equipment();
        auto name       = RANDOM_FLAG ? "" : request_name();

        /* IMPORTANT(incomingstick): If this is not a pointer, it will segfault during GC... idk why */
        character = new Character(race, scores, charClass, bg, skills, name);

        if(!hp && !equipment) {
            status = EXIT_FAILURE;
        }
    }

    if(status != EXIT_FAILURE) {
        SHEET_FLAG ? 
            printf("%s", character->to_ascii_sheet().c_str()) :
            printf("%s", character->to_string().c_str());
    }

    return status;
}